

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

Opnd * __thiscall IR::Opnd::Copy(Opnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  IntConstOpnd *pIVar3;
  Opnd *pOVar4;
  MemRefOpnd *pMVar5;
  RegBVOpnd *pRVar6;
  LabelOpnd *pLVar7;
  PropertySymOpnd *pPVar8;
  Int64ConstOpnd *pIVar9;
  ArrayRegOpnd *pAVar10;
  FloatConstOpnd *pFVar11;
  IndirOpnd *pIVar12;
  AddrOpnd *pAVar13;
  SymOpnd *pSVar14;
  RegOpnd *pRVar15;
  HelperCallOpnd *pHVar16;
  undefined4 *puVar17;
  
  switch(this->m_kind) {
  case OpndKindIntConst:
    pIVar3 = IntConstOpnd::CopyInternal((IntConstOpnd *)this,func);
    return &pIVar3->super_Opnd;
  case OpndKindInt64Const:
    pIVar9 = Int64ConstOpnd::CopyInternal((Int64ConstOpnd *)this,func);
    return &pIVar9->super_Opnd;
  case OpndKindFloatConst:
    pFVar11 = FloatConstOpnd::CopyInternal((FloatConstOpnd *)this,func);
    return &pFVar11->super_Opnd;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar17 = 1;
    Js::Throw::ReportAssert
              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
               ,0x19f,"((0))","UNREACHED");
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case OpndKindHelperCall:
    break;
  case OpndKindSym:
    bVar2 = SymOpnd::IsPropertySymOpnd((SymOpnd *)this);
    if (bVar2) {
      pPVar8 = PropertySymOpnd::CopyInternalSub((PropertySymOpnd *)this,func);
      return (Opnd *)pPVar8;
    }
    pSVar14 = SymOpnd::CopyInternal((SymOpnd *)this,func);
    return &pSVar14->super_Opnd;
  case OpndKindReg:
    bVar2 = RegOpnd::IsArrayRegOpnd((RegOpnd *)this);
    if (bVar2) {
      pAVar10 = ArrayRegOpnd::CopyInternalSub((ArrayRegOpnd *)this,func);
      return (Opnd *)pAVar10;
    }
    pRVar15 = RegOpnd::CopyInternal((RegOpnd *)this,func);
    return &pRVar15->super_Opnd;
  case OpndKindAddr:
    pAVar13 = AddrOpnd::CopyInternal((AddrOpnd *)this,func);
    return &pAVar13->super_Opnd;
  case OpndKindIndir:
    pIVar12 = IndirOpnd::CopyInternal((IndirOpnd *)this,func);
    return &pIVar12->super_Opnd;
  case OpndKindLabel:
    pLVar7 = LabelOpnd::CopyInternal((LabelOpnd *)this,func);
    return &pLVar7->super_Opnd;
  case OpndKindMemRef:
    pMVar5 = MemRefOpnd::CopyInternal((MemRefOpnd *)this,func);
    return &pMVar5->super_Opnd;
  case OpndKindRegBV:
    pRVar6 = RegBVOpnd::CopyInternal((RegBVOpnd *)this,func);
    return &pRVar6->super_Opnd;
  case OpndKindList:
    pOVar4 = ListOpnd::CopyInternal((ListOpnd *)this,func);
    return pOVar4;
  }
  bVar2 = HelperCallOpnd::IsDiagHelperCallOpnd((HelperCallOpnd *)this);
  if (bVar2) {
    pOVar4 = (Opnd *)DiagHelperCallOpnd::CopyInternalSub((DiagHelperCallOpnd *)this,func);
    return pOVar4;
  }
  pHVar16 = HelperCallOpnd::CopyInternal((HelperCallOpnd *)this,func);
  return &pHVar16->super_Opnd;
}

Assistant:

Opnd * Opnd::Copy(Func *func)
{
    switch (this->m_kind)
    {
    case OpndKindIntConst:
        return static_cast<IntConstOpnd*>(this)->CopyInternal(func);

    case OpndKindInt64Const:
        return static_cast<Int64ConstOpnd*>(this)->CopyInternal(func);

    case OpndKindFloatConst:
        return static_cast<FloatConstOpnd*>(this)->CopyInternal(func);

    case OpndKindHelperCall:
        if ((*static_cast<HelperCallOpnd*>(this)).IsDiagHelperCallOpnd())
        {
            return static_cast<DiagHelperCallOpnd*>(this)->CopyInternalSub(func);
        }
        return static_cast<HelperCallOpnd*>(this)->CopyInternal(func);

    case OpndKindSym:
        if ((*static_cast<SymOpnd*>(this)).IsPropertySymOpnd())
        {
            return static_cast<PropertySymOpnd*>(this)->CopyInternalSub(func);
        }
        return static_cast<SymOpnd*>(this)->CopyInternal(func);

    case OpndKindReg:
        if ((*static_cast<RegOpnd*>(this)).IsArrayRegOpnd())
        {
            return static_cast<ArrayRegOpnd*>(this)->CopyInternalSub(func);
        }
        return static_cast<RegOpnd*>(this)->CopyInternal(func);

    case OpndKindAddr:
        return static_cast<AddrOpnd*>(this)->CopyInternal(func);

    case OpndKindIndir:
        return static_cast<IndirOpnd*>(this)->CopyInternal(func);

    case OpndKindList:
        return static_cast<ListOpnd*>(this)->CopyInternal(func);

    case OpndKindMemRef:
        return static_cast<MemRefOpnd*>(this)->CopyInternal(func);

    case OpndKindLabel:
        return static_cast<LabelOpnd*>(this)->CopyInternal(func);

    case OpndKindRegBV:
        return static_cast<RegBVOpnd*>(this)->CopyInternal(func);
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);

    };
}